

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

void cpsm::str_cat_impl<char_const*,unsigned_long,char_const*,unsigned_long>
               (stringstream *ss,char **x,unsigned_long args,char *args_1,unsigned_long args_2)

{
  char *in_RCX;
  unsigned_long *in_RDX;
  stringstream *in_RSI;
  long in_RDI;
  unsigned_long in_R8;
  
  std::operator<<((ostream *)(in_RDI + 0x10),*(char **)in_RSI);
  str_cat_impl<unsigned_long,char_const*,unsigned_long>(in_RSI,in_RDX,in_RCX,in_R8);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}